

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O2

uint8_t * google::protobuf::io::(anonymous_namespace)::DecodeVarint64KnownSize<3ul>
                    (uint8_t *buffer,uint64_t *value)

{
  Nullable<const_char_*> failure_msg;
  int local_24;
  LogMessage local_20;
  
  local_20.errno_saver_.saved_errno_ = 3;
  local_20._4_4_ = 0;
  local_24 = 0;
  failure_msg = absl::lts_20250127::log_internal::Check_GTImpl<unsigned_long,int>
                          ((unsigned_long *)&local_20,&local_24,"N > 0");
  if (failure_msg == (Nullable<const_char_*>)0x0) {
    *value = ((ulong)buffer[1] * 0x80 + ((ulong)buffer[2] << 0xe | (ulong)*buffer)) - 0x4080;
    return buffer + 3;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&local_20,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/coded_stream.cc"
             ,0x199,failure_msg);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_20);
}

Assistant:

const uint8_t* DecodeVarint64KnownSize(const uint8_t* buffer, uint64_t* value) {
  ABSL_DCHECK_GT(N, 0);
  uint64_t result = static_cast<uint64_t>(buffer[N - 1]) << (7 * (N - 1));
  for (size_t i = 0, offset = 0; i < N - 1; i++, offset += 7) {
    result += static_cast<uint64_t>(buffer[i] - 0x80) << offset;
  }
  *value = result;
  return buffer + N;
}